

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void P_CheckPlayerSprite(AActor *actor,int *spritenum,DVector2 *scale)

{
  userinfo_t *this;
  double dVar1;
  double dVar2;
  uint uVar3;
  player_t *ppVar4;
  FPlayerSkin *pFVar5;
  FPlayerSkin *pFVar6;
  int iVar7;
  int iVar8;
  AActor *pAVar9;
  int *piVar10;
  
  ppVar4 = actor->player;
  this = &ppVar4->userinfo;
  iVar7 = userinfo_t::GetSkin(this);
  if ((iVar7 != 0) && (((actor->flags4).Value & 0x20) == 0)) {
    pAVar9 = AActor::GetDefault(actor);
    pFVar5 = skins;
    dVar1 = (pAVar9->Scale).X;
    dVar2 = (pAVar9->Scale).Y;
    iVar7 = userinfo_t::GetSkin(this);
    scale->X = (pFVar5[iVar7].Scale.X / dVar1) * scale->X;
    pFVar5 = skins;
    iVar7 = userinfo_t::GetSkin(this);
    scale->Y = (pFVar5[iVar7].Scale.Y / dVar2) * scale->Y;
  }
  pFVar5 = skins;
  if (0.75 < ppVar4->crouchfactor || ppVar4->crouchfactor == 0.75) {
    return;
  }
  uVar3 = *spritenum;
  if ((uVar3 == actor->SpawnState->sprite) ||
     (uVar3 == *(uint *)&(ppVar4->mo->super_AActor).field_0x49c)) {
    piVar10 = (int *)&(ppVar4->mo->super_AActor).field_0x49c;
  }
  else {
    if ((((actor->flags4).Value & 0x20) != 0) ||
       ((iVar7 = userinfo_t::GetSkin(this), pFVar6 = skins, uVar3 != pFVar5[iVar7].sprite &&
        (iVar7 = *spritenum, iVar8 = userinfo_t::GetSkin(this), iVar7 != pFVar6[iVar8].crouchsprite)
        ))) goto LAB_004ebf61;
    pFVar5 = skins;
    iVar7 = userinfo_t::GetSkin(this);
    piVar10 = &pFVar5[iVar7].crouchsprite;
  }
  if (0 < *piVar10) {
    *spritenum = *piVar10;
    return;
  }
LAB_004ebf61:
  if ((ppVar4->playerstate != '\x01') &&
     (ppVar4->crouchfactor <= 0.75 && ppVar4->crouchfactor != 0.75)) {
    scale->Y = scale->Y * 0.5;
  }
  return;
}

Assistant:

void P_CheckPlayerSprite(AActor *actor, int &spritenum, DVector2 &scale)
{
	player_t *player = actor->player;
	int crouchspriteno;

	if (player->userinfo.GetSkin() != 0 && !(actor->flags4 & MF4_NOSKIN))
	{
		// Convert from default scale to skin scale.
		DVector2 defscale = actor->GetDefault()->Scale;
		scale.X *= skins[player->userinfo.GetSkin()].Scale.X / defscale.X;
		scale.Y *= skins[player->userinfo.GetSkin()].Scale.Y / defscale.Y;
	}

	// Set the crouch sprite?
	if (player->crouchfactor < 0.75)
	{
		if (spritenum == actor->SpawnState->sprite || spritenum == player->mo->crouchsprite) 
		{
			crouchspriteno = player->mo->crouchsprite;
		}
		else if (!(actor->flags4 & MF4_NOSKIN) &&
				(spritenum == skins[player->userinfo.GetSkin()].sprite ||
				 spritenum == skins[player->userinfo.GetSkin()].crouchsprite))
		{
			crouchspriteno = skins[player->userinfo.GetSkin()].crouchsprite;
		}
		else
		{ // no sprite -> squash the existing one
			crouchspriteno = -1;
		}

		if (crouchspriteno > 0) 
		{
			spritenum = crouchspriteno;
		}
		else if (player->playerstate != PST_DEAD && player->crouchfactor < 0.75)
		{
			scale.Y *= 0.5;
		}
	}
}